

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_negation.c
# Opt level: O1

_Bool array_container_negation_range
                (array_container_t *src,int range_start,int range_end,container_t **dst)

{
  ushort uVar1;
  uint64_t *puVar2;
  bool bVar3;
  int iVar4;
  bitset_container_t *pbVar5;
  array_container_t *paVar6;
  uint16_t *puVar7;
  ulong uVar8;
  uint in_R8D;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ushort uVar14;
  
  if (range_end - range_start == 0 || range_end < range_start) {
    paVar6 = array_container_clone(src);
    *dst = paVar6;
  }
  else {
    iVar4 = src->cardinality + -1;
    uVar12 = 0;
    iVar13 = iVar4;
    do {
      if (iVar13 < (int)uVar12) {
        uVar12 = ~uVar12;
        uVar11 = uVar12;
        break;
      }
      uVar11 = uVar12 + iVar13 >> 1;
      uVar1 = *(ushort *)((long)src->array + (ulong)(uVar12 + iVar13 & 0xfffffffe));
      if (uVar1 < (ushort)range_start) {
        uVar12 = uVar11 + 1;
        bVar3 = true;
        uVar11 = in_R8D;
      }
      else if ((ushort)range_start < uVar1) {
        iVar13 = uVar11 - 1;
        bVar3 = true;
        uVar11 = in_R8D;
      }
      else {
        bVar3 = false;
      }
      in_R8D = uVar11;
    } while (bVar3);
    uVar11 = (int)uVar11 >> 0x1f ^ uVar11;
    uVar9 = 0;
    do {
      if (iVar4 < (int)uVar9) {
        uVar12 = ~uVar9;
        break;
      }
      uVar10 = uVar9 + iVar4 >> 1;
      uVar1 = *(ushort *)((long)src->array + (ulong)(uVar9 + iVar4 & 0xfffffffe));
      uVar14 = (ushort)(range_end - 1U);
      if (uVar1 < uVar14) {
        uVar9 = uVar10 + 1;
        bVar3 = true;
      }
      else if (uVar14 < uVar1) {
        iVar4 = uVar10 - 1;
        bVar3 = true;
      }
      else {
        bVar3 = false;
        uVar12 = uVar10;
      }
    } while (bVar3);
    uVar9 = -uVar12 - 2;
    if (-1 < (int)uVar12) {
      uVar9 = uVar12;
    }
    iVar4 = (range_end - range_start) + src->cardinality + (uVar11 - uVar9) * 2 + -2;
    if (0x1000 < iVar4) {
      pbVar5 = bitset_container_from_array(src);
      if (range_end != range_start) {
        puVar2 = pbVar5->words;
        uVar8 = (ulong)((uint)range_start >> 6);
        uVar12 = range_end - 1U >> 6;
        puVar2[uVar8] = ~(-1L << ((byte)range_start & 0x3f) ^ puVar2[uVar8]);
        if ((uint)range_start >> 6 < uVar12) {
          do {
            puVar2[uVar8] = ~puVar2[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar12 != uVar8);
        }
        puVar2[uVar12] = puVar2[uVar12] ^ 0xffffffffffffffffU >> (-(char)range_end & 0x3fU);
      }
      pbVar5->cardinality = iVar4;
      *dst = pbVar5;
      return true;
    }
    paVar6 = array_container_create_given_capacity(iVar4);
    *dst = paVar6;
    if (iVar4 == 0) {
      iVar4 = 0;
    }
    else {
      memcpy(paVar6->array,src->array,(ulong)uVar11 * 2);
      uVar12 = uVar11;
      if ((range_start < range_end) && ((int)uVar11 <= (int)uVar9)) {
        puVar7 = src->array;
        do {
          if ((uint16_t)range_start == puVar7[uVar11]) {
            uVar11 = uVar11 + 1;
          }
          else {
            uVar8 = (ulong)uVar12;
            uVar12 = uVar12 + 1;
            paVar6->array[uVar8] = (uint16_t)range_start;
          }
          range_start = range_start + 1;
        } while ((range_start < range_end) && ((int)uVar11 <= (int)uVar9));
      }
      if (range_start < range_end) {
        puVar7 = paVar6->array + uVar12;
        uVar12 = (uVar12 + range_end) - range_start;
        do {
          *puVar7 = (uint16_t)range_start;
          range_start = range_start + 1;
          puVar7 = puVar7 + 1;
        } while (range_end != range_start);
      }
      memcpy(paVar6->array + uVar12,src->array + ((long)(int)uVar9 + 1U & 0xffffffff),
             ((long)src->cardinality - ((long)(int)uVar9 + 1U)) * 2);
    }
    paVar6->cardinality = iVar4;
  }
  return false;
}

Assistant:

bool array_container_negation_range(const array_container_t *src,
                                    const int range_start, const int range_end,
                                    container_t **dst) {
    /* close port of the Java implementation */
    if (range_start >= range_end) {
        *dst = array_container_clone(src);
        return false;
    }

    int32_t start_index =
        binarySearch(src->array, src->cardinality, (uint16_t)range_start);
    if (start_index < 0) start_index = -start_index - 1;

    int32_t last_index =
        binarySearch(src->array, src->cardinality, (uint16_t)(range_end - 1));
    if (last_index < 0) last_index = -last_index - 2;

    const int32_t current_values_in_range = last_index - start_index + 1;
    const int32_t span_to_be_flipped = range_end - range_start;
    const int32_t new_values_in_range =
        span_to_be_flipped - current_values_in_range;
    const int32_t cardinality_change =
        new_values_in_range - current_values_in_range;
    const int32_t new_cardinality = src->cardinality + cardinality_change;

    if (new_cardinality > DEFAULT_MAX_SIZE) {
        bitset_container_t *temp = bitset_container_from_array(src);
        bitset_flip_range(temp->words, (uint32_t)range_start,
                          (uint32_t)range_end);
        temp->cardinality = new_cardinality;
        *dst = temp;
        return true;
    }

    array_container_t *arr =
        array_container_create_given_capacity(new_cardinality);
    *dst = (container_t *)arr;
    if (new_cardinality == 0) {
        arr->cardinality = new_cardinality;
        return false;  // we are done.
    }
    // copy stuff before the active area
    memcpy(arr->array, src->array, start_index * sizeof(uint16_t));

    // work on the range
    int32_t out_pos = start_index, in_pos = start_index;
    int32_t val_in_range = range_start;
    for (; val_in_range < range_end && in_pos <= last_index; ++val_in_range) {
        if ((uint16_t)val_in_range != src->array[in_pos]) {
            arr->array[out_pos++] = (uint16_t)val_in_range;
        } else {
            ++in_pos;
        }
    }
    for (; val_in_range < range_end; ++val_in_range)
        arr->array[out_pos++] = (uint16_t)val_in_range;

    // content after the active range
    memcpy(arr->array + out_pos, src->array + (last_index + 1),
           (src->cardinality - (last_index + 1)) * sizeof(uint16_t));
    arr->cardinality = new_cardinality;
    return false;
}